

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_wrapper_l(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint32_t uVar1;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  uVar1 = verify_miniscript_or_i_property(0x43b901,node->type_properties);
  node->type_properties = uVar1;
  if (node->type_properties == 0) {
    node_local._4_4_ = -2;
  }
  else {
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_wrapper_l(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    node->type_properties = verify_miniscript_or_i_property(
        MINISCRIPT_PROPERTY_OP_0, node->type_properties);
    if (!node->type_properties)
        return WALLY_EINVAL;
    return WALLY_OK;
}